

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQLastTimeStepOrQBG.cpp
# Opt level: O2

void __thiscall
FactoredQLastTimeStepOrQBG::FactoredQLastTimeStepOrQBG
          (FactoredQLastTimeStepOrQBG *this,
          shared_ptr<const_PlanningUnitFactoredDecPOMDPDiscrete> *puf)

{
  int *piVar1;
  sp_counted_base *psVar2;
  QBG *this_00;
  shared_ptr<const_PlanningUnitDecPOMDPDiscrete> local_38;
  
  (this->super_FactoredQLastTimeStepOrElse).super_FactoredQFunctionStateJAOHInterface.
  super_QFunctionJAOHInterface =
       (QFunctionJAOHInterface)&PTR__QFunctionForDecPOMDPInterface_005db8d0;
  QFunctionForFactoredDecPOMDPInterface::QFunctionForFactoredDecPOMDPInterface
            ((QFunctionForFactoredDecPOMDPInterface *)
             &(this->super_FactoredQLastTimeStepOrElse).super_QFunctionForFactoredDecPOMDP,
             &PTR_construction_vtable_152__005db1d8);
  FactoredQLastTimeStepOrElse::FactoredQLastTimeStepOrElse
            (&this->super_FactoredQLastTimeStepOrElse,&PTR_construction_vtable_136__005db130,puf);
  (this->super_FactoredQLastTimeStepOrElse).super_FactoredQFunctionStateJAOHInterface.
  super_QFunctionJAOHInterface = (QFunctionJAOHInterface)0x5daf60;
  *(undefined8 *)&(this->super_FactoredQLastTimeStepOrElse).super_QFunctionForFactoredDecPOMDP =
       0x5db0a8;
  this_00 = (QBG *)operator_new(0x60);
  local_38.px = &puf->px->super_PlanningUnitDecPOMDPDiscrete;
  local_38.pn.pi_ = (puf->pn).pi_;
  psVar2 = (puf->pn).pi_;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar2->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  QBG::QBG(this_00,&local_38);
  this->_m_QBG = this_00;
  boost::detail::shared_count::~shared_count(&local_38.pn);
  this->_m_initialized = false;
  return;
}

Assistant:

FactoredQLastTimeStepOrQBG::
FactoredQLastTimeStepOrQBG(const boost::shared_ptr<const PlanningUnitFactoredDecPOMDPDiscrete> &puf) :
    FactoredQLastTimeStepOrElse(puf)
{
    _m_QBG=new QBG(puf);
    _m_initialized = false;
}